

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O0

Uint32 Diligent::GetResourceSampleCount(ITextureView *pTexView)

{
  Char *Message;
  long *plVar1;
  long lVar2;
  char (*in_RCX) [20];
  undefined1 local_30 [8];
  string msg;
  ITextureView *pTexView_local;
  
  msg.field_2._8_8_ = pTexView;
  if (pTexView == (ITextureView *)0x0) {
    FormatString<char[26],char[20]>
              ((string *)local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pTexView != nullptr",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetResourceSampleCount",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x15b);
    std::__cxx11::string::~string((string *)local_30);
  }
  plVar1 = (long *)(**(code **)(*(long *)msg.field_2._8_8_ + 0x50))();
  lVar2 = (**(code **)(*plVar1 + 0x20))();
  return *(Uint32 *)(lVar2 + 0x20);
}

Assistant:

inline Uint32 GetResourceSampleCount(const ITextureView* pTexView)
{
    VERIFY_EXPR(pTexView != nullptr);
    return const_cast<ITextureView*>(pTexView)->GetTexture()->GetDesc().SampleCount;
}